

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void dwt_interleave_v(dwt_t *v,int *a,int x)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  
  piVar3 = v->mem;
  iVar1 = v->sn;
  if (iVar1 != 0) {
    iVar2 = v->cas;
    lVar5 = 0;
    piVar4 = a;
    do {
      piVar3[(long)iVar2 + lVar5 * 2] = *piVar4;
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + x;
    } while (iVar1 != (int)lVar5);
  }
  iVar1 = v->dn;
  if (iVar1 != 0) {
    iVar2 = v->cas;
    piVar4 = a + v->sn * x;
    lVar5 = 0;
    do {
      piVar3[(lVar5 * 2 + 1) - (long)iVar2] = *piVar4;
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + x;
    } while (iVar1 != (int)lVar5);
  }
  return;
}

Assistant:

static void dwt_interleave_v(dwt_t* v, int *a, int x) {
    int *ai = a;
    int *bi = v->mem + v->cas;
    int  i = v->sn;
    while( i-- ) {
      *bi = *ai;
	  bi += 2;
	  ai += x;
    }
    ai = a + (v->sn * x);
    bi = v->mem + 1 - v->cas;
    i = v->dn ;
    while( i-- ) {
      *bi = *ai;
	  bi += 2;  
	  ai += x;
    }
}